

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest_StripSourceRetentionFieldOptions_Test
::TestBody(RetentionStripTest_StripSourceRetentionFieldOptions_Test *this)

{
  FileDescriptor *this_00;
  bool bVar1;
  Descriptor *this_01;
  DescriptorProto *this_02;
  FieldDescriptorProto *pFVar2;
  char *pcVar3;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher_00;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher_01;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> *matcher_02;
  AssertHelper local_bb0;
  Message local_ba8;
  FieldOptions local_ba0;
  FieldOptions local_b08;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> local_a70;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  local_9d8;
  undefined1 local_940 [8];
  AssertionResult gtest_ar_3;
  Message local_928;
  FieldDescriptorProto local_920;
  FieldOptions local_8c0;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> local_828;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  local_790;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_2;
  Message local_6e0;
  DescriptorProto local_6d8;
  FieldOptions local_5e8;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> local_550;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  local_4b8;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_1;
  Message local_408;
  FileDescriptorProto local_400;
  FieldOptions local_308;
  EqualsProtoMatcherP<google::protobuf::FieldOptions> local_270;
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  local_1d8;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  FieldDescriptor *local_120;
  FieldDescriptor *local_118;
  FieldDescriptor *field;
  string_view local_100;
  Descriptor *local_f0;
  Descriptor *local_e8;
  Descriptor *message;
  undefined1 local_d0 [8];
  FieldOptions expected_options;
  string_view local_28;
  FileDescriptor *local_18;
  FileDescriptor *file;
  RetentionStripTest_StripSourceRetentionFieldOptions_Test *this_local;
  
  file = (FileDescriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "\n      message TestMessage {\n        optional string test_field = 1 [(source_retention_option) = 123, (options) = {\n          i1: 123\n          i2: 456\n          c { s: \"abc\" }\n          rc { s: \"abc\" }\n        }, (repeated_options) = {\n          i1: 111 i2: 222\n        }];\n      }\n\n      message Options {\n        optional int32 i1 = 1 [retention = RETENTION_SOURCE];\n        optional int32 i2 = 2;\n        message ChildMessage {\n          optional string s = 1 [retention = RETENTION_SOURCE];\n        }\n        optional ChildMessage c = 3;\n        repeated ChildMessage rc = 4;\n      }\n\n      extend google.protobuf.FieldOptions {\n        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];\n        optional Options options = 50001;\n        repeated Options repeated_options = 50002;\n      }"
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&expected_options.field_0 + 0x80),"foo.proto");
  local_18 = RetentionStripTest::ParseSchema
                       (&this->super_RetentionStripTest,local_28,stack0xffffffffffffffc8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&message,
             "\n        [google.protobuf.internal.options] {\n          i2: 456\n          c {}\n          rc {}\n        }\n        [google.protobuf.internal.repeated_options] { i2: 222 }"
            );
  RetentionStripTest::BuildDynamicProto<google::protobuf::FieldOptions>
            ((FieldOptions *)local_d0,&this->super_RetentionStripTest,_message);
  this_00 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"TestMessage")
  ;
  local_f0 = FileDescriptor::FindMessageTypeByName(this_00,local_100);
  this_01 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::Descriptor_const*>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                       ,0x189,"file->FindMessageTypeByName(\"TestMessage\")",&local_f0);
  local_e8 = this_01;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"test_field");
  local_120 = Descriptor::FindFieldByName(this_01,stack0xfffffffffffffed0);
  local_118 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FieldDescriptor_const*>
                        ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
                         ,0x18b,"message->FindFieldByName(\"test_field\")",&local_120);
  FieldOptions::FieldOptions(&local_308,(FieldOptions *)local_d0);
  EqualsProto<google::protobuf::FieldOptions>(&local_270,&local_308);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            (&local_1d8,(internal *)&local_270,matcher);
  StripSourceRetentionOptions(&local_400,local_18,false);
  this_02 = FileDescriptorProto::message_type(&local_400,0);
  pFVar2 = DescriptorProto::field(this_02,0);
  FieldDescriptorProto::options(pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(local_140,(char *)&local_1d8,
               (FieldOptions *)
               "StripSourceRetentionOptions(*file).message_type(0).field(0).options()");
  FileDescriptorProto::~FileDescriptorProto(&local_400);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  ::~PredicateFormatterFromMatcher(&local_1d8);
  EqualsProtoMatcherP<google::protobuf::FieldOptions>::~EqualsProtoMatcherP(&local_270);
  FieldOptions::~FieldOptions(&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,399,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  FieldOptions::FieldOptions(&local_5e8,(FieldOptions *)local_d0);
  EqualsProto<google::protobuf::FieldOptions>(&local_550,&local_5e8);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            (&local_4b8,(internal *)&local_550,matcher_00);
  StripSourceRetentionOptions(&local_6d8,local_e8);
  pFVar2 = DescriptorProto::field(&local_6d8,0);
  FieldDescriptorProto::options(pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(local_420,(char *)&local_4b8,
               (FieldOptions *)"StripSourceRetentionOptions(*message).field(0).options()");
  DescriptorProto::~DescriptorProto(&local_6d8);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  ::~PredicateFormatterFromMatcher(&local_4b8);
  EqualsProtoMatcherP<google::protobuf::FieldOptions>::~EqualsProtoMatcherP(&local_550);
  FieldOptions::~FieldOptions(&local_5e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x191,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  FieldOptions::FieldOptions(&local_8c0,(FieldOptions *)local_d0);
  EqualsProto<google::protobuf::FieldOptions>(&local_828,&local_8c0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            (&local_790,(internal *)&local_828,matcher_01);
  StripSourceRetentionOptions(&local_920,local_118);
  FieldDescriptorProto::options(&local_920);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(local_6f8,(char *)&local_790,
               (FieldOptions *)"StripSourceRetentionOptions(*field).options()");
  FieldDescriptorProto::~FieldDescriptorProto(&local_920);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  ::~PredicateFormatterFromMatcher(&local_790);
  EqualsProtoMatcherP<google::protobuf::FieldOptions>::~EqualsProtoMatcherP(&local_828);
  FieldOptions::~FieldOptions(&local_8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_928);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_928);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  FieldOptions::FieldOptions(&local_b08,(FieldOptions *)local_d0);
  EqualsProto<google::protobuf::FieldOptions>(&local_a70,&local_b08);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
            (&local_9d8,(internal *)&local_a70,matcher_02);
  StripLocalSourceRetentionOptions(&local_ba0,local_118);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>>
  ::operator()(local_940,(char *)&local_9d8,
               (FieldOptions *)"StripLocalSourceRetentionOptions(*field)");
  FieldOptions::~FieldOptions(&local_ba0);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::FieldOptions>_>
  ::~PredicateFormatterFromMatcher(&local_9d8);
  EqualsProtoMatcherP<google::protobuf::FieldOptions>::~EqualsProtoMatcherP(&local_a70);
  FieldOptions::~FieldOptions(&local_b08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(&local_ba8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_940);
    testing::internal::AssertHelper::AssertHelper
              (&local_bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x195,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_bb0);
    testing::Message::~Message(&local_ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  FieldOptions::~FieldOptions((FieldOptions *)local_d0);
  return;
}

Assistant:

TEST_F(RetentionStripTest, StripSourceRetentionFieldOptions) {
  const FileDescriptor* file = ParseSchema(R"schema(
      message TestMessage {
        optional string test_field = 1 [(source_retention_option) = 123, (options) = {
          i1: 123
          i2: 456
          c { s: "abc" }
          rc { s: "abc" }
        }, (repeated_options) = {
          i1: 111 i2: 222
        }];
      }

      message Options {
        optional int32 i1 = 1 [retention = RETENTION_SOURCE];
        optional int32 i2 = 2;
        message ChildMessage {
          optional string s = 1 [retention = RETENTION_SOURCE];
        }
        optional ChildMessage c = 3;
        repeated ChildMessage rc = 4;
      }

      extend google.protobuf.FieldOptions {
        optional int32 source_retention_option = 50000 [retention = RETENTION_SOURCE];
        optional Options options = 50001;
        repeated Options repeated_options = 50002;
      })schema");

  FieldOptions expected_options = BuildDynamicProto<FieldOptions>(
      R"pb(
        [google.protobuf.internal.options] {
          i2: 456
          c {}
          rc {}
        }
        [google.protobuf.internal.repeated_options] { i2: 222 })pb");
  const Descriptor* message =
      ABSL_DIE_IF_NULL(file->FindMessageTypeByName("TestMessage"));
  const FieldDescriptor* field =
      ABSL_DIE_IF_NULL(message->FindFieldByName("test_field"));

  EXPECT_THAT(
      StripSourceRetentionOptions(*file).message_type(0).field(0).options(),
      EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*message).field(0).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripSourceRetentionOptions(*field).options(),
              EqualsProto(expected_options));
  EXPECT_THAT(StripLocalSourceRetentionOptions(*field),
              EqualsProto(expected_options));
}